

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precond.c
# Opt level: O0

Vector * ILUPrecond(QMatrix *A,Vector *y,Vector *c,double Omega)

{
  Boolean BVar1;
  ElOrderType EVar2;
  QMatrix *pQVar3;
  QMatrix *pQVar4;
  QMatrix *pQVar5;
  QMatrix *pQVar6;
  Vector *pVVar7;
  double Omega_local;
  Vector *c_local;
  Vector *y_local;
  QMatrix *A_local;
  
  Q_Lock(A);
  V_Lock(y);
  V_Lock(c);
  BVar1 = Q_GetSymmetry(A);
  if (BVar1 != False) {
    EVar2 = Q_GetElOrder(A);
    if (EVar2 == Rowws) {
      pQVar3 = ILUFactor(A);
      pQVar3 = Diag_Q(pQVar3);
      pQVar4 = ILUFactor(A);
      pQVar4 = Lower_Q(pQVar4);
      pQVar3 = Add_QQ(pQVar3,pQVar4);
      pQVar4 = ILUFactor(A);
      pQVar4 = Diag_Q(pQVar4);
      pQVar5 = ILUFactor(A);
      pQVar5 = Diag_Q(pQVar5);
      pQVar6 = ILUFactor(A);
      pQVar6 = Upper_Q(pQVar6);
      pQVar5 = Add_QQ(pQVar5,pQVar6);
      pVVar7 = MulInv_QV(pQVar5,c);
      pVVar7 = Mul_QV(pQVar4,pVVar7);
      pVVar7 = MulInv_QV(pQVar3,pVVar7);
      Asgn_VV(y,pVVar7);
      goto LAB_001124a7;
    }
  }
  pQVar3 = ILUFactor(A);
  pQVar3 = Diag_Q(pQVar3);
  pQVar4 = ILUFactor(A);
  pQVar4 = Upper_Q(pQVar4);
  pQVar3 = Add_QQ(pQVar3,pQVar4);
  pQVar4 = ILUFactor(A);
  pQVar4 = Diag_Q(pQVar4);
  pQVar5 = ILUFactor(A);
  pQVar5 = Diag_Q(pQVar5);
  pQVar6 = ILUFactor(A);
  pQVar6 = Lower_Q(pQVar6);
  pQVar5 = Add_QQ(pQVar5,pQVar6);
  pVVar7 = MulInv_QV(pQVar5,c);
  pVVar7 = Mul_QV(pQVar4,pVVar7);
  pVVar7 = MulInv_QV(pQVar3,pVVar7);
  Asgn_VV(y,pVVar7);
LAB_001124a7:
  Q_Unlock(A);
  V_Unlock(y);
  V_Unlock(c);
  return y;
}

Assistant:

Vector *ILUPrecond(QMatrix *A, Vector *y, Vector *c, double Omega)
/* incomplete factorization preconditioner */
{
    (void) Omega;
    
    Q_Lock(A);
    V_Lock(y);
    V_Lock(c);
    
    /*
     *  if Q symmetric with rowwise stored elements
     *
     *    (Diag(C) + Upper(C)) * Diag(C)^(-1) * (Diag(C) + Lower(C)) y = c
     *    y = (Diag(C) + Upper(C))^(-1) * Diag(C) * (Diag(C) + Lower(C))^(-1) c
     *
     *  otherwise
     *
     *    (Diag(B) + Lower(B)) * Diag(B)^(-1) * (Diag(B) + Upper(B)) y = c
     *    y = (Diag(B) + Upper(B))^(-1) * Diag(B) * (Diag(B) + Lower(B))^(-1) c
     *
     *  B denotes the incomplete factorized matrix A
     */

    if (Q_GetSymmetry(A) && Q_GetElOrder(A) == Rowws)
        Asgn_VV(y, MulInv_QV(Add_QQ(Diag_Q(ILUFactor(A)), Lower_Q(ILUFactor(A))), 
            Mul_QV(Diag_Q(ILUFactor(A)),
            MulInv_QV(Add_QQ(Diag_Q(ILUFactor(A)), Upper_Q(ILUFactor(A))), c))));
    else
        Asgn_VV(y, MulInv_QV(Add_QQ(Diag_Q(ILUFactor(A)), Upper_Q(ILUFactor(A))), 
            Mul_QV(Diag_Q(ILUFactor(A)),
            MulInv_QV(Add_QQ(Diag_Q(ILUFactor(A)), Lower_Q(ILUFactor(A))), c))));

    Q_Unlock(A);
    V_Unlock(y);
    V_Unlock(c);

    return(y);
}